

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-ft-stroker.c
# Opt level: O3

PVG_FT_Error PVG_FT_Stroker_LineTo(PVG_FT_Stroker stroker,PVG_FT_Vector *to)

{
  long lVar1;
  PVG_FT_Pos PVar2;
  PVG_FT_Fixed line_length;
  PVG_FT_Angle start_angle;
  long lVar3;
  PVG_FT_Vector local_68;
  PVG_FT_Fixed local_50;
  PVG_FT_Vector local_48;
  
  lVar3 = (stroker->center).x;
  local_68.x = to->x - lVar3;
  lVar1 = (stroker->center).y;
  local_68.y = to->y - lVar1;
  if (to->y != lVar1 || to->x != lVar3) {
    line_length = PVG_FT_Vector_Length(&local_68);
    start_angle = PVG_FT_Atan2(local_68.x,local_68.y);
    PVG_FT_Vector_From_Polar(&local_68,stroker->radius,start_angle + 0x5a0000);
    local_50 = line_length;
    if (stroker->first_point == '\0') {
      stroker->angle_out = start_angle;
      ft_stroker_process_corner(stroker,line_length);
    }
    else {
      ft_stroker_subpath_start(stroker,start_angle,line_length);
    }
    lVar3 = 0x70;
    do {
      local_48.x = to->x + local_68.x;
      local_48.y = to->y + local_68.y;
      ft_stroke_border_lineto
                ((PVG_FT_StrokeBorder)((long)stroker->borders + lVar3 + -0x70),&local_48,'\x01');
      local_68.x = -local_68.x;
      local_68.y = -local_68.y;
      lVar3 = lVar3 + 0x28;
    } while ((int)lVar3 != 0xc0);
    stroker->angle_in = start_angle;
    PVar2 = to->y;
    (stroker->center).x = to->x;
    (stroker->center).y = PVar2;
    stroker->line_length = local_50;
  }
  return 0;
}

Assistant:

PVG_FT_Error PVG_FT_Stroker_LineTo(PVG_FT_Stroker stroker, PVG_FT_Vector* to)
{
    PVG_FT_Error        error = 0;
    PVG_FT_StrokeBorder border;
    PVG_FT_Vector       delta;
    PVG_FT_Angle        angle;
    PVG_FT_Int          side;
    PVG_FT_Fixed        line_length;

    delta.x = to->x - stroker->center.x;
    delta.y = to->y - stroker->center.y;

    /* a zero-length lineto is a no-op; avoid creating a spurious corner */
    if (delta.x == 0 && delta.y == 0) goto Exit;

    /* compute length of line */
    line_length = PVG_FT_Vector_Length(&delta);

    angle = PVG_FT_Atan2(delta.x, delta.y);
    PVG_FT_Vector_From_Polar(&delta, stroker->radius, angle + PVG_FT_ANGLE_PI2);

    /* process corner if necessary */
    if (stroker->first_point) {
        /* This is the first segment of a subpath.  We need to     */
        /* add a point to each border at their respective starting */
        /* point locations.                                        */
        error = ft_stroker_subpath_start(stroker, angle, line_length);
        if (error) goto Exit;
    } else {
        /* process the current corner */
        stroker->angle_out = angle;
        error = ft_stroker_process_corner(stroker, line_length);
        if (error) goto Exit;
    }

    /* now add a line segment to both the `inside' and `outside' paths */
    for (border = stroker->borders, side = 1; side >= 0; side--, border++) {
        PVG_FT_Vector point;

        point.x = to->x + delta.x;
        point.y = to->y + delta.y;

        /* the ends of lineto borders are movable */
        error = ft_stroke_border_lineto(border, &point, TRUE);
        if (error) goto Exit;

        delta.x = -delta.x;
        delta.y = -delta.y;
    }

    stroker->angle_in = angle;
    stroker->center = *to;
    stroker->line_length = line_length;

Exit:
    return error;
}